

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cc
# Opt level: O0

tuple<std::shared_ptr<pstack::Elf::Object>,_unsigned_long,_Elf64_Sym> * __thiscall
pstack::Procman::Process::resolveSymbolDetail
          (tuple<std::shared_ptr<pstack::Elf::Object>,_unsigned_long,_Elf64_Sym>
           *__return_storage_ptr__,Process *this,char *name,bool includeDebug,
          function<bool_(std::basic_string_view<char,_std::char_traits<char>_>)> *match)

{
  char *pcVar1;
  bool bVar2;
  reference __args_1;
  string *this_00;
  Exception *this_01;
  Exception *pEVar3;
  Exception local_2e8;
  type_conflict *local_148;
  type_conflict *idx_1;
  type *sym_1;
  string local_130 [32];
  undefined1 local_110 [16];
  pair<Elf64_Sym,_unsigned_long> local_100;
  int local_dc;
  type_conflict *local_d8;
  type_conflict *idx;
  type *sym;
  allocator<char> local_b1;
  string local_b0 [32];
  pair<Elf64_Sym,_unsigned_long> local_90;
  undefined1 local_70 [8];
  sptr obj;
  pair<const_unsigned_long,_pstack::Procman::MappedObject> *loaded;
  iterator __end2;
  iterator __begin2;
  map<unsigned_long,_pstack::Procman::MappedObject,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_pstack::Procman::MappedObject>_>_>
  *__range2;
  function<bool_(std::basic_string_view<char,_std::char_traits<char>_>)> *match_local;
  char *pcStack_20;
  bool includeDebug_local;
  char *name_local;
  Process *this_local;
  
  pcStack_20 = name;
  name_local = (char *)this;
  this_local = (Process *)__return_storage_ptr__;
  __end2 = std::
           map<unsigned_long,_pstack::Procman::MappedObject,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_pstack::Procman::MappedObject>_>_>
           ::begin(&this->objects);
  loaded = (pair<const_unsigned_long,_pstack::Procman::MappedObject> *)
           std::
           map<unsigned_long,_pstack::Procman::MappedObject,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_pstack::Procman::MappedObject>_>_>
           ::end(&this->objects);
  do {
    bVar2 = std::operator==(&__end2,(_Self *)&loaded);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      this_01 = (Exception *)__cxa_allocate_exception();
      memset(&local_2e8,0,0x1a0);
      Exception::Exception(&local_2e8);
      pEVar3 = Exception::operator<<(&local_2e8,(char (*) [8])"symbol ");
      pEVar3 = Exception::operator<<(pEVar3,&stack0xffffffffffffffe0);
      pEVar3 = Exception::operator<<(pEVar3,(char (*) [11])" not found");
      Exception::Exception(this_01,pEVar3);
      __cxa_throw(this_01,&Exception::typeinfo,Exception::~Exception);
    }
    __args_1 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_long,_pstack::Procman::MappedObject>_>::
               operator*(&__end2);
    this_00 = MappedObject::name_abi_cxx11_(&__args_1->second);
    join_0x00000010_0x00000000_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          )std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
    bVar2 = std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>)>::operator()
                      (match,(basic_string_view<char,_std::char_traits<char>_>)
                             join_0x00000010_0x00000000_);
    if (bVar2) {
      MappedObject::object((MappedObject *)local_70,(Context *)&__args_1->second);
      std::__shared_ptr_access<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)local_70);
      pcVar1 = pcStack_20;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_b0,pcVar1,&local_b1);
      pstack::Elf::Object::findDynamicSymbol((string *)&local_90);
      std::__cxx11::string::~string(local_b0);
      std::allocator<char>::~allocator(&local_b1);
      idx = (type_conflict *)std::get<0ul,Elf64_Sym,unsigned_long>(&local_90);
      local_d8 = std::get<1ul,Elf64_Sym,unsigned_long>(&local_90);
      if (*(short *)((long)idx + 6) == 0) {
        if (includeDebug) {
          MappedObject::object((MappedObject *)local_110,(Context *)&__args_1->second);
          std::__shared_ptr_access<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)local_110);
          pcVar1 = pcStack_20;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (local_130,pcVar1,(allocator<char> *)((long)&sym_1 + 7));
          pstack::Elf::Object::findDebugSymbol((string *)(local_110 + 0x10));
          std::__cxx11::string::~string(local_130);
          std::allocator<char>::~allocator((allocator<char> *)((long)&sym_1 + 7));
          std::shared_ptr<pstack::Elf::Object>::~shared_ptr
                    ((shared_ptr<pstack::Elf::Object> *)local_110);
          idx_1 = (type_conflict *)
                  std::get<0ul,Elf64_Sym,unsigned_long>
                            ((pair<Elf64_Sym,_unsigned_long> *)(local_110 + 0x10));
          local_148 = std::get<1ul,Elf64_Sym,unsigned_long>
                                ((pair<Elf64_Sym,_unsigned_long> *)(local_110 + 0x10));
          if (*(short *)((long)idx_1 + 6) != 0) {
            std::make_tuple<std::shared_ptr<pstack::Elf::Object>&,unsigned_long_const&,Elf64_Sym&>
                      (__return_storage_ptr__,(shared_ptr<pstack::Elf::Object> *)local_70,
                       &__args_1->first,(anon_struct_24_6_4a0f5e99 *)idx_1);
            local_dc = 1;
            goto LAB_001ae04f;
          }
        }
        local_dc = 0;
      }
      else {
        std::make_tuple<std::shared_ptr<pstack::Elf::Object>&,unsigned_long_const&,Elf64_Sym&>
                  (__return_storage_ptr__,(shared_ptr<pstack::Elf::Object> *)local_70,
                   &__args_1->first,(anon_struct_24_6_4a0f5e99 *)idx);
        local_dc = 1;
      }
LAB_001ae04f:
      std::shared_ptr<pstack::Elf::Object>::~shared_ptr((shared_ptr<pstack::Elf::Object> *)local_70)
      ;
      if (local_dc != 0) {
        return __return_storage_ptr__;
      }
    }
    std::_Rb_tree_iterator<std::pair<const_unsigned_long,_pstack::Procman::MappedObject>_>::
    operator++(&__end2);
  } while( true );
}

Assistant:

std::tuple<Elf::Object::sptr, Elf::Addr, Elf::Sym>
Process::resolveSymbolDetail(const char *name, bool includeDebug,
        std::function<bool(std::string_view)> match)
{
    for (auto &loaded : objects) {
        if (!match(loaded.second.name()))
           continue;
        auto obj = loaded.second.object(context);
        auto [sym,idx] = obj->findDynamicSymbol(name);
        if (sym.st_shndx != SHN_UNDEF)
           return std::make_tuple(obj, loaded.first, sym);
        if (includeDebug) {
           auto [sym, idx] = loaded.second.object(context)->findDebugSymbol(name);
           if (sym.st_shndx != SHN_UNDEF)
              return std::make_tuple(obj, loaded.first, sym);
        }
    }
    throw (Exception() << "symbol " << name << " not found");
}